

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O2

wstring * cmsys::Encoding::ToWide(wstring *__return_storage_ptr__,string *str)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  wstring local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar2 = 0;
  while( true ) {
    if (uVar2 < str->_M_string_length) {
      auVar3 = std::__cxx11::string::at((ulong)str);
      if (*auVar3._0_8_ != '\0') {
        ToWide_abi_cxx11_(&local_40,(Encoding *)((str->_M_dataplus)._M_p + uVar2),auVar3._8_8_);
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
        std::__cxx11::wstring::~wstring((wstring *)&local_40);
      }
    }
    lVar1 = std::__cxx11::string::find((char)str,0);
    if (lVar1 == -1) break;
    uVar2 = lVar1 + 1;
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Encoding::ToWide(const std::string& str)
{
  std::wstring wstr;
#  if defined(_WIN32)
  const int wlength =
    MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(),
                        int(str.size()), nullptr, 0);
  if (wlength > 0) {
    wchar_t* wdata = new wchar_t[wlength];
    int r = MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(),
                                int(str.size()), wdata, wlength);
    if (r > 0) {
      wstr = std::wstring(wdata, wlength);
    }
    delete[] wdata;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      wstr += ToWide(str.c_str() + pos);
    }
    nullPos = str.find('\0', pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      wstr += wchar_t('\0');
    }
  } while (nullPos != std::string::npos);
#  endif
  return wstr;
}